

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O2

void duckdb_brotli::DecodeLiteralBlockSwitch(BrotliDecoderStateInternal *s)

{
  ushort uVar1;
  ushort uVar2;
  ulong uVar3;
  long *plVar4;
  uint *puVar5;
  HuffmanCode **ppHVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  HuffmanCode *pHVar11;
  uint64_t uVar12;
  HuffmanCode *pHVar13;
  
  uVar3 = s->num_block_types[0];
  if (1 < uVar3) {
    pHVar11 = s->block_type_trees;
    uVar10 = (s->br).val_;
    uVar7 = (s->br).bit_pos_;
    if (uVar7 < 0x11) {
      plVar4 = (long *)(s->br).next_in;
      uVar10 = uVar10 | *plVar4 << ((byte)uVar7 & 0x3f);
      uVar7 = uVar7 + 0x30;
      (s->br).next_in = (uint8_t *)((long)plVar4 + 6);
    }
    pHVar11 = pHVar11 + (uVar10 & 0xff);
    bVar8 = pHVar11->bits;
    if (8 < bVar8) {
      uVar7 = uVar7 - 8;
      uVar10 = uVar10 >> 8;
      pHVar11 = pHVar11 + (*(ulong *)(kBrotliBitMask + (ulong)(bVar8 - 8) * 8) & uVar10) +
                          (ulong)pHVar11->value;
      bVar8 = pHVar11->bits;
    }
    pHVar13 = s->block_len_trees;
    uVar7 = uVar7 - bVar8;
    uVar10 = uVar10 >> (bVar8 & 0x3f);
    (s->br).bit_pos_ = uVar7;
    (s->br).val_ = uVar10;
    uVar1 = pHVar11->value;
    if (uVar7 < 0x11) {
      plVar4 = (long *)(s->br).next_in;
      uVar10 = uVar10 | *plVar4 << ((byte)uVar7 & 0x3f);
      uVar7 = uVar7 + 0x30;
      (s->br).next_in = (uint8_t *)((long)plVar4 + 6);
    }
    pHVar13 = pHVar13 + (uVar10 & 0xff);
    uVar9 = (ulong)pHVar13->bits;
    if (8 < uVar9) {
      uVar7 = uVar7 - 8;
      uVar10 = uVar10 >> 8;
      pHVar13 = pHVar13 + (*(ulong *)(kBrotliBitMask + (ulong)(pHVar13->bits - 8) * 8) & uVar10) +
                          (ulong)pHVar13->value;
      uVar9 = (ulong)pHVar13->bits;
    }
    uVar10 = uVar10 >> ((byte)uVar9 & 0x3f);
    uVar7 = uVar7 - uVar9;
    (s->br).bit_pos_ = uVar7;
    (s->br).val_ = uVar10;
    bVar8 = (&DAT_010d70f2)[(ulong)pHVar13->value * 4];
    uVar2 = (&_kBrotliPrefixCodeRanges)[(ulong)pHVar13->value * 2];
    if (uVar7 < 0x21) {
      puVar5 = (uint *)(s->br).next_in;
      uVar10 = uVar10 | (ulong)*puVar5 << ((byte)uVar7 & 0x3f);
      uVar7 = uVar7 + 0x20;
      (s->br).next_in = (uint8_t *)(puVar5 + 1);
    }
    uVar9 = *(ulong *)(kBrotliBitMask + (ulong)bVar8 * 8);
    (s->br).bit_pos_ = uVar7 - bVar8;
    (s->br).val_ = uVar10 >> (bVar8 & 0x3f);
    s->block_length[0] = (uVar9 & uVar10) + (ulong)uVar2;
    if ((ulong)uVar1 == 0) {
      uVar12 = s->block_type_rb[0];
    }
    else if (uVar1 == 1) {
      uVar12 = s->block_type_rb[1] + 1;
    }
    else {
      uVar12 = (ulong)uVar1 - 2;
    }
    uVar10 = 0;
    if (uVar3 <= uVar12) {
      uVar10 = uVar3;
    }
    uVar10 = uVar12 - uVar10;
    ppHVar6 = (s->literal_hgroup).htrees;
    s->block_type_rb[0] = s->block_type_rb[1];
    s->block_type_rb[1] = uVar10;
    s->context_map_slice = s->context_map + uVar10 * 0x40;
    s->trivial_literal_context =
         (uint)((s->trivial_literal_contexts[uVar10 >> 5] >> ((uint)uVar10 & 0x1f) & 1) != 0);
    s->literal_htree = ppHVar6[s->context_map[uVar10 * 0x40]];
    s->context_lookup = &_kBrotliContextLookupTable + ((s->context_modes[uVar10] & 3) << 9);
  }
  return;
}

Assistant:

static BROTLI_INLINE BROTLI_BOOL DecodeBlockTypeAndLength(int safe, BrotliDecoderState *s, int tree_type) {
	brotli_reg_t max_block_type = s->num_block_types[tree_type];
	const HuffmanCode *type_tree = &s->block_type_trees[tree_type * BROTLI_HUFFMAN_MAX_SIZE_258];
	const HuffmanCode *len_tree = &s->block_len_trees[tree_type * BROTLI_HUFFMAN_MAX_SIZE_26];
	BrotliBitReader *br = &s->br;
	brotli_reg_t *ringbuffer = &s->block_type_rb[tree_type * 2];
	brotli_reg_t block_type;
	if (max_block_type <= 1) {
		return BROTLI_FALSE;
	}

	/* Read 0..15 + 3..39 bits. */
	if (!safe) {
		block_type = ReadSymbol(type_tree, br);
		s->block_length[tree_type] = ReadBlockLength(len_tree, br);
	} else {
		BrotliBitReaderState memento;
		BrotliBitReaderSaveState(br, &memento);
		if (!SafeReadSymbol(type_tree, br, &block_type))
			return BROTLI_FALSE;
		if (!SafeReadBlockLength(s, &s->block_length[tree_type], len_tree, br)) {
			s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
			BrotliBitReaderRestoreState(br, &memento);
			return BROTLI_FALSE;
		}
	}

	if (block_type == 1) {
		block_type = ringbuffer[1] + 1;
	} else if (block_type == 0) {
		block_type = ringbuffer[0];
	} else {
		block_type -= 2;
	}
	if (block_type >= max_block_type) {
		block_type -= max_block_type;
	}
	ringbuffer[0] = ringbuffer[1];
	ringbuffer[1] = block_type;
	return BROTLI_TRUE;
}